

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_attach.cpp
# Opt level: O2

unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>,_true> __thiscall
duckdb::Transformer::TransformAttach(Transformer *this,PGAttachStmt *stmt)

{
  _Head_base<0UL,_duckdb::AttachInfo_*,_false> _Var1;
  _Head_base<0UL,_duckdb::AttachInfo_*,_false> _Var2;
  _Head_base<0UL,_duckdb::AttachStatement_*,_false> _Var3;
  OnCreateConflict OVar4;
  pointer pAVar5;
  PGDefElem *pPVar6;
  PGValue *pPVar7;
  pointer pCVar8;
  mapped_type *this_00;
  pointer pAVar9;
  long in_RDX;
  Transformer *this_01;
  undefined8 *puVar10;
  PGValue val_00;
  _Head_base<0UL,_duckdb::AttachInfo_*,_false> local_110;
  _Head_base<0UL,_duckdb::AttachStatement_*,_false> local_108;
  allocator local_fa;
  allocator local_f9;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  string local_e8;
  Value val;
  LogicalType local_88;
  optional_ptr<duckdb::Transformer,_true> local_70;
  
  make_uniq<duckdb::AttachStatement>();
  make_uniq<duckdb::AttachInfo>();
  if (*(char **)(in_RDX + 0x10) == (char *)0x0) {
    val.type_._0_8_ =
         &val.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    val.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    val.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         0;
  }
  else {
    ::std::__cxx11::string::string((string *)&val,*(char **)(in_RDX + 0x10),&local_f9);
  }
  pAVar5 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_110);
  ::std::__cxx11::string::operator=((string *)&pAVar5->name,(string *)&val);
  ::std::__cxx11::string::~string((string *)&val);
  pAVar5 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_110);
  this_01 = (Transformer *)&pAVar5->path;
  ::std::__cxx11::string::assign((char *)this_01);
  OVar4 = TransformOnConflict(this_01,*(PGOnCreateConflict *)(in_RDX + 0x28));
  pAVar5 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_110);
  pAVar5->on_conflict = OVar4;
  puVar10 = *(undefined8 **)(in_RDX + 0x18);
  local_108._M_head_impl = (AttachStatement *)this;
  if (puVar10 != (undefined8 *)0x0) {
    while (puVar10 = (undefined8 *)puVar10[1], puVar10 != (undefined8 *)0x0) {
      def_elem.ptr = (PGDefElem *)*puVar10;
      LogicalType::LogicalType(&local_88,SQLNULL);
      Value::Value(&val,&local_88);
      LogicalType::~LogicalType(&local_88);
      pPVar6 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      if (pPVar6->arg == (PGNode *)0x0) {
        Value::BOOLEAN((Value *)&stack0xffffffffffffff90,true);
        Value::operator=(&val,(Value *)&stack0xffffffffffffff90);
        Value::~Value((Value *)&stack0xffffffffffffff90);
      }
      else {
        pPVar6 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
        local_e8._M_dataplus._M_p = (pointer)pPVar6->arg;
        pPVar7 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator*
                           ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_e8);
        val_00.val.ival._0_4_ = pPVar7->type;
        val_00._0_8_ = stmt;
        val_00.val.ival._4_4_ = 0;
        TransformValue((Transformer *)&stack0xffffffffffffff90,val_00);
        pCVar8 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                               *)&stack0xffffffffffffff90);
        Value::operator=(&val,&pCVar8->value);
        if (local_70.ptr != (Transformer *)0x0) {
          (*(code *)(((local_70.ptr)->parent).ptr)->options)();
        }
      }
      pAVar5 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
               operator->((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                           *)&local_110);
      pPVar6 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      ::std::__cxx11::string::string((string *)&local_e8,pPVar6->defname,&local_fa);
      StringUtil::Lower((string *)&stack0xffffffffffffff90,&local_e8);
      this_00 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pAVar5->options,(key_type *)&stack0xffffffffffffff90);
      Value::operator=(this_00,&val);
      ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
      ::std::__cxx11::string::~string((string *)&local_e8);
      Value::~Value(&val);
    }
  }
  _Var3._M_head_impl = local_108._M_head_impl;
  pAVar9 = unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>,_true>::
           operator->((unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>,_true>
                       *)local_108._M_head_impl);
  _Var2._M_head_impl = local_110._M_head_impl;
  local_110._M_head_impl = (AttachInfo *)0x0;
  _Var1._M_head_impl =
       (pAVar9->info).super_unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>
       ._M_t.super___uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::AttachInfo_*,_std::default_delete<duckdb::AttachInfo>_>.
       super__Head_base<0UL,_duckdb::AttachInfo_*,_false>._M_head_impl;
  (pAVar9->info).super_unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t
  .super___uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AttachInfo_*,_std::default_delete<duckdb::AttachInfo>_>.
  super__Head_base<0UL,_duckdb::AttachInfo_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (AttachInfo *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ParseInfo + 8))();
    if (local_110._M_head_impl != (AttachInfo *)0x0) {
      (*((local_110._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>_>)
         (_Tuple_impl<0UL,_duckdb::AttachStatement_*,_std::default_delete<duckdb::AttachStatement>_>
         )_Var3._M_head_impl;
}

Assistant:

unique_ptr<AttachStatement> Transformer::TransformAttach(duckdb_libpgquery::PGAttachStmt &stmt) {
	auto result = make_uniq<AttachStatement>();
	auto info = make_uniq<AttachInfo>();
	info->name = stmt.name ? stmt.name : string();
	info->path = stmt.path;
	info->on_conflict = TransformOnConflict(stmt.onconflict);

	if (stmt.options) {
		duckdb_libpgquery::PGListCell *cell;
		for_each_cell(cell, stmt.options->head) {
			auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(cell->data.ptr_value);
			Value val;
			if (def_elem->arg) {
				val = TransformValue(*PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg))->value;
			} else {
				val = Value::BOOLEAN(true);
			}
			info->options[StringUtil::Lower(def_elem->defname)] = std::move(val);
		}
	}
	result->info = std::move(info);
	return result;
}